

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunCommonSubexpressionElimination(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  uint uVar1;
  VmInstruction *pVVar2;
  VmConstant *pVVar3;
  VmConstant *pVVar4;
  bool bVar5;
  bool bVar6;
  VmFunction *pVVar7;
  VmBlock *pVVar8;
  VmConstant *local_a0;
  VmConstant *local_98;
  VmConstant *prevArgAsConst;
  VmConstant *currArgAsConst;
  VmValue *prevArg;
  VmValue *currArg;
  uint e;
  uint i;
  bool same;
  VmInstruction *pVStack_58;
  uint distance;
  VmInstruction *prev;
  VmInstruction *next_1;
  VmInstruction *curr_1;
  VmBlock *block;
  VmBlock *next;
  VmBlock *curr;
  VmFunction *function;
  VmValue *value_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar7 = getType<VmFunction>(value);
  if (pVVar7 == (VmFunction *)0x0) {
    pVVar8 = getType<VmBlock>(value);
    if (pVVar8 != (VmBlock *)0x0) {
      pVVar2 = pVVar8->firstInstruction;
LAB_0035fb77:
      next_1 = pVVar2;
      if (next_1 != (VmInstruction *)0x0) {
        pVVar2 = next_1->nextSibling;
        if ((((next_1->super_VmValue).hasSideEffects & 1U) == 0) &&
           (((next_1->super_VmValue).hasMemoryAccess & 1U) == 0)) {
          pVStack_58 = next_1->prevSibling;
          i = 0;
          for (; pVStack_58 != (VmInstruction *)0x0 && i < 0x40;
              pVStack_58 = pVStack_58->prevSibling) {
            if ((pVStack_58->cmd == next_1->cmd) &&
               ((pVStack_58->arguments).count == (next_1->arguments).count)) {
              bVar5 = true;
              currArg._4_4_ = 0;
              uVar1 = (next_1->arguments).count;
              for (; currArg._4_4_ < uVar1; currArg._4_4_ = currArg._4_4_ + 1) {
                pVVar3 = (VmConstant *)(next_1->arguments).data[currArg._4_4_];
                pVVar4 = (VmConstant *)(pVStack_58->arguments).data[currArg._4_4_];
                local_98 = pVVar3;
                if ((pVVar3->super_VmValue).typeID != 1) {
                  local_98 = (VmConstant *)0x0;
                }
                local_a0 = pVVar4;
                if ((pVVar4->super_VmValue).typeID != 1) {
                  local_a0 = (VmConstant *)0x0;
                }
                if ((local_98 == (VmConstant *)0x0) || (local_a0 == (VmConstant *)0x0)) {
                  if (pVVar3 != pVVar4) {
                    bVar5 = false;
                  }
                }
                else {
                  bVar6 = VmConstant::operator==(local_98,local_a0);
                  if (!bVar6) {
                    bVar5 = false;
                  }
                }
              }
              if (bVar5) {
                anon_unknown.dwarf_1a3010::ReplaceValueUsersWith
                          (module,&next_1->super_VmValue,&pVStack_58->super_VmValue,
                           &module->commonSubexprEliminations);
                break;
              }
            }
            i = i + 1;
          }
        }
        goto LAB_0035fb77;
      }
    }
  }
  else {
    next = pVVar7->firstBlock;
    while (next != (VmBlock *)0x0) {
      pVVar8 = next->nextSibling;
      RunCommonSubexpressionElimination(ctx,module,&next->super_VmValue);
      next = pVVar8;
    }
  }
  return;
}

Assistant:

void RunCommonSubexpressionElimination(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		VmBlock *curr = function->firstBlock;

		while(curr)
		{
			VmBlock *next = curr->nextSibling;
			RunCommonSubexpressionElimination(ctx, module, curr);
			curr = next;
		}
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			VmInstruction *next = curr->nextSibling;

			if(curr->hasSideEffects || curr->hasMemoryAccess)
			{
				curr = next;
				continue;
			}

			VmInstruction *prev = curr->prevSibling;

			unsigned distance = 0;

			while(prev && distance < 64)
			{
				if(prev->cmd == curr->cmd && prev->arguments.count == curr->arguments.count)
				{
					bool same = true;

					for(unsigned i = 0, e = curr->arguments.count; i < e; i++)
					{
						VmValue *currArg = curr->arguments.data[i];
						VmValue *prevArg = prev->arguments.data[i];

						VmConstant *currArgAsConst = currArg->typeID == VmConstant::myTypeID ? static_cast<VmConstant*>(currArg) : NULL;
						VmConstant *prevArgAsConst = prevArg->typeID == VmConstant::myTypeID ? static_cast<VmConstant*>(prevArg) : NULL;

						if(currArgAsConst && prevArgAsConst)
						{
							if(!(*currArgAsConst == *prevArgAsConst))
								same = false;
						}
						else if(currArg != prevArg)
						{
							same = false;
						}
					}

					if(same)
					{
						ReplaceValueUsersWith(module, curr, prev, &module->commonSubexprEliminations);
						break;
					}
				}

				prev = prev->prevSibling;
				distance++;
			}

			curr = next;
		}
	}
}